

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int loop(void)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  undefined1 local_e8 [40];
  undefined1 local_c0 [4];
  int return_code;
  string local_90 [32];
  undefined1 local_70 [8];
  Command cmd;
  string command;
  bool finished;
  
  bVar1 = 0;
  while ((bool)(bVar1 ^ 1)) {
    print_prompt();
    get_command_abi_cxx11_();
    std::__cxx11::string::string(local_90,(string *)&cmd.return_code);
    Command::Command((Command *)local_70,(string *)local_90);
    std::__cxx11::string::~string(local_90);
    Command::get_command_name_abi_cxx11_((Command *)local_c0);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0,"exit");
    std::__cxx11::string::~string((string *)local_c0);
    if (bVar2) {
      bVar1 = 1;
    }
    else {
      local_e8._36_4_ = Command::execute((Command *)local_70);
      poVar3 = std::operator<<((ostream *)&std::cout,"Return code for [");
      Command::get_command_name_abi_cxx11_((Command *)local_e8);
      poVar3 = std::operator<<(poVar3,(string *)local_e8);
      poVar3 = std::operator<<(poVar3,"] : ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_e8._36_4_);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_e8);
      std::ostream::flush();
    }
    Command::~Command((Command *)local_70);
    std::__cxx11::string::~string((string *)&cmd.return_code);
  }
  return 0;
}

Assistant:

int loop()
{
    bool finished(false);
    while (!finished)
    {
        print_prompt();
        std::string command = get_command();
        Command cmd = Command{command};

        if (cmd.get_command_name() == "exit")
        {
            finished = true;
        }
        else
        {
            int return_code = cmd.execute();
            std::cout << "Return code for [" << cmd.get_command_name() << "] : " << return_code << std::endl;
            std::cout.flush();
        }
    }
    return 0;
}